

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O1

int cJSONUtils_ApplyPatchesCaseSensitive(cJSON *object,cJSON *patches)

{
  int iVar1;
  cJSON *patch;
  
  iVar1 = cJSON_IsArray(patches);
  if (iVar1 == 0) {
    iVar1 = 1;
  }
  else {
    if (patches == (cJSON *)0x0) {
      patch = (cJSON *)0x0;
    }
    else {
      patch = patches->child;
    }
    while ((iVar1 = 0, patch != (cJSON *)0x0 && (iVar1 = apply_patch(object,patch,1), iVar1 == 0)))
    {
      patch = patch->next;
    }
  }
  return iVar1;
}

Assistant:

CJSON_PUBLIC(int) cJSONUtils_ApplyPatchesCaseSensitive(cJSON * const object, const cJSON * const patches)
{
    const cJSON *current_patch = NULL;
    int status = 0;

    if (!cJSON_IsArray(patches))
    {
        /* malformed patches. */
        return 1;
    }

    if (patches != NULL)
    {
        current_patch = patches->child;
    }

    while (current_patch != NULL)
    {
        status = apply_patch(object, current_patch, true);
        if (status != 0)
        {
            return status;
        }
        current_patch = current_patch->next;
    }

    return 0;
}